

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryMappingTests.cpp
# Opt level: O0

bool __thiscall
vkt::memory::anon_unknown_0::ReferenceMemory::modifyXor
          (ReferenceMemory *this,size_t pos,deUint8 value,deUint8 mask)

{
  bool bVar1;
  reference pvVar2;
  byte *pbVar3;
  bool local_1c;
  bool isOk;
  deUint8 mask_local;
  deUint8 value_local;
  size_t pos_local;
  ReferenceMemory *this_local;
  
  bVar1 = BitVector::get(&this->m_defined,pos);
  local_1c = true;
  if (bVar1) {
    pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->m_bytes,pos);
    local_1c = *pvVar2 == value;
  }
  pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&this->m_bytes,pos);
  *pbVar3 = value ^ mask;
  BitVector::set(&this->m_defined,pos,true);
  BitVector::set(&this->m_flushed,pos / this->m_atomSize,false);
  return local_1c;
}

Assistant:

bool modifyXor (size_t pos, deUint8 value, deUint8 mask)
	{
		const bool isOk = !m_defined.get(pos)
						|| m_bytes[pos] == value;

		m_bytes[pos] = value ^ mask;
		m_defined.set(pos, true);
		m_flushed.set(pos / m_atomSize, false);

		return isOk;
	}